

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>
::basic_msgpack_cursor<std::istream&>
          (basic_msgpack_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this
          ,basic_istream<char,_std::char_traits<char>_> *source,msgpack_decode_options *options,
          allocator<char> *alloc)

{
  uint uVar1;
  basic_staj_visitor<char> *in_RDI;
  msgpack_decode_options *unaff_retaddr;
  basic_istream<char,_std::char_traits<char>_> *in_stack_00000008;
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_00000010;
  allocator<char> *in_stack_00000070;
  basic_json_visitor<char> *in_stack_00000078;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *in_stack_00000080;
  basic_staj_visitor<char> *alloc_00;
  
  alloc_00 = in_RDI;
  ser_context::ser_context((ser_context *)&in_RDI[8].index_);
  basic_staj_cursor<char>::basic_staj_cursor((basic_staj_cursor<char> *)in_RDI);
  (in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor = (_func_int **)(vtable + 0x18);
  in_RDI[8].index_ = (size_t)(vtable + 0xb8);
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_msgpack_parser<std::istream&>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,(allocator<char> *)alloc_00);
  basic_staj_visitor<char>::basic_staj_visitor(in_RDI);
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::
  basic_item_event_visitor_to_json_visitor(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  *(undefined1 *)&in_RDI[8].shape_.size_ = 0;
  basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::cursor_mode
            ((basic_msgpack_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *)
             &in_RDI->event_,true);
  uVar1 = (*(in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor[3])();
  if ((uVar1 & 1) == 0) {
    (*(in_RDI->super_basic_json_visitor<char>)._vptr_basic_json_visitor[7])();
  }
  return;
}

Assistant:

basic_msgpack_cursor(Sourceable&& source,
        const msgpack_decode_options& options = msgpack_decode_options(),
        const Allocator& alloc = Allocator())
        : parser_(std::forward<Sourceable>(source), options, alloc),
          cursor_handler_adaptor_(cursor_visitor_, alloc)
    {
        parser_.cursor_mode(true);
        if (!done())
        {
            next();
        }
    }